

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O2

string * __thiscall helics::EndpointInfo::getSourceTargets_abi_cxx11_(EndpointInfo *this)

{
  string *this_00;
  pointer pEVar1;
  pointer pEVar2;
  string local_50;
  
  this_00 = &this->sourceTargets;
  if ((this->sourceTargets)._M_string_length == 0) {
    pEVar2 = (this->sourceInformation).
             super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pEVar1 = (this->sourceInformation).
             super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pEVar2 != pEVar1) {
      if ((long)pEVar1 - (long)pEVar2 == 0x48) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar2->key)
        ;
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,'[');
        pEVar1 = (this->sourceInformation).
                 super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pEVar2 = (this->sourceInformation).
                      super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                      ._M_impl.super__Vector_impl_data._M_start; pEVar2 != pEVar1;
            pEVar2 = pEVar2 + 1) {
          generateJsonQuotedString(&local_50,(string *)&pEVar2->key);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 &local_50);
          std::__cxx11::string::~string((string *)&local_50);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,','
                   );
        }
        (this->sourceTargets)._M_dataplus._M_p[(this->sourceTargets)._M_string_length - 1] = ']';
      }
    }
  }
  return this_00;
}

Assistant:

const std::string& EndpointInfo::getSourceTargets() const
{
    if (sourceTargets.empty()) {
        if (!sourceInformation.empty()) {
            if (sourceInformation.size() == 1) {
                sourceTargets = sourceInformation.front().key;
            } else {
                sourceTargets.push_back('[');
                for (const auto& src : sourceInformation) {
                    sourceTargets.append(generateJsonQuotedString(src.key));
                    sourceTargets.push_back(',');
                }
                sourceTargets.back() = ']';
            }
        }
    }
    return sourceTargets;
}